

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# splitview.c
# Opt level: O1

void drawGrid(float scale,int steps)

{
  fd_set *__exceptfds;
  fd_set *__writefds;
  int iVar1;
  fd_set *__readfds;
  undefined4 in_register_0000003c;
  timeval *in_R8;
  float fVar2;
  vec3 center;
  mat4x4 view;
  float local_58 [4];
  float local_48 [16];
  
  glPushMatrix(CONCAT44(in_register_0000003c,steps));
  glClearColor(0x3d4ccccd,0x3d4ccccd,0x3e4ccccd,0);
  glClear(0x4000);
  local_58[2] = 0.0;
  local_58[0] = 0.0;
  local_58[1] = 0.0;
  __readfds = (fd_set *)&DAT_0010f17c;
  __exceptfds = (fd_set *)&DAT_0010f188;
  mat4x4_look_at((vec4 *)local_48,(float *)&DAT_0010f17c,local_58,(float *)&DAT_0010f188);
  glLoadMatrixf((vec4 *)local_48);
  glDepthMask(0);
  glColor3f(0,0x3f000000,0x3f000000);
  select(1,__readfds,__writefds,__exceptfds,in_R8);
  fVar2 = -2.75;
  iVar1 = 0xc;
  do {
    glVertex3f(0xc0300000,fVar2,0);
    glVertex3f(0x40300000,fVar2);
    fVar2 = fVar2 + 0.5;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  fVar2 = -2.75;
  iVar1 = 0xc;
  do {
    glVertex3f(fVar2,0xc0300000,0);
    glVertex3f(fVar2,0x40300000);
    fVar2 = fVar2 + 0.5;
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  glEnd();
  glDepthMask(1);
  glPopMatrix();
  return;
}

Assistant:

static void drawGrid(float scale, int steps)
{
    int i;
    float x, y;
    mat4x4 view;

    glPushMatrix();

    // Set background to some dark bluish grey
    glClearColor(0.05f, 0.05f, 0.2f, 0.0f);
    glClear(GL_COLOR_BUFFER_BIT);

    // Setup modelview matrix (flat XY view)
    {
        vec3 eye = { 0.f, 0.f, 1.f };
        vec3 center = { 0.f, 0.f, 0.f };
        vec3 up = { 0.f, 1.f, 0.f };
        mat4x4_look_at(view, eye, center, up);
    }
    glLoadMatrixf((const GLfloat*) view);

    // We don't want to update the Z-buffer
    glDepthMask(GL_FALSE);

    // Set grid color
    glColor3f(0.0f, 0.5f, 0.5f);

    glBegin(GL_LINES);

    // Horizontal lines
    x = scale * 0.5f * (float) (steps - 1);
    y = -scale * 0.5f * (float) (steps - 1);
    for (i = 0;  i < steps;  i++)
    {
        glVertex3f(-x, y, 0.0f);
        glVertex3f(x, y, 0.0f);
        y += scale;
    }

    // Vertical lines
    x = -scale * 0.5f * (float) (steps - 1);
    y = scale * 0.5f * (float) (steps - 1);
    for (i = 0;  i < steps;  i++)
    {
        glVertex3f(x, -y, 0.0f);
        glVertex3f(x, y, 0.0f);
        x += scale;
    }

    glEnd();

    // Enable Z-buffer writing again
    glDepthMask(GL_TRUE);

    glPopMatrix();
}